

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O2

int __thiscall
vkt::sr::anon_unknown_0::TextureGatherTests::init(TextureGatherTests *this,EVP_PKEY_CTX *ctx)

{
  WrapMode wrapT;
  ChannelType CVar1;
  FilterMode magFilter;
  TestContext *pTVar2;
  anon_struct_24_2_3f8e1b6f *paVar3;
  OffsetSize OVar4;
  OffsetSize OVar5;
  TextureSwizzleComponent TVar6;
  TestNode *node;
  ulong uVar7;
  TestNode *node_00;
  TestNode *pTVar8;
  TestNode *pTVar9;
  long lVar10;
  OffsetSize OVar11;
  char *description;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  OffsetSize OVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  ChannelOrder CVar21;
  TextureFormat TVar22;
  bool bVar23;
  bool bVar24;
  allocator<char> local_369;
  OffsetSize local_368;
  TextureType_conflict local_364;
  OffsetSize local_360;
  char local_35a;
  char local_359;
  ulong local_358;
  TestNode *local_350;
  MaybeTextureSwizzle swizzle;
  string caseName_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  int local_2d0;
  allocator<char> local_2c9;
  TestNode *local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  TestNode *local_2a0;
  long local_298;
  long local_290;
  MaybeTextureSwizzle swizzle_1;
  TestNode *local_250;
  TestNode *local_240;
  anon_struct_24_2_3f8e1b6f textureSizes [2];
  anon_struct_16_2_3ce319a5 formats [4];
  string caseName;
  
  formats[0].name = "rgba8";
  formats[0].format.order = RGBA;
  formats[0].format.type = UNORM_INT8;
  formats[1].name = "rgba8ui";
  formats[1].format.order = RGBA;
  formats[1].format.type = UNSIGNED_INT8;
  formats[2].name = "rgba8i";
  formats[2].format.order = RGBA;
  formats[2].format.type = SIGNED_INT8;
  formats[3].name = "depth32f";
  formats[3].format.order = D;
  formats[3].format.type = FLOAT;
  textureSizes[0].name = "size_pot";
  textureSizes[0].size.m_data[0] = 0x40;
  textureSizes[0].size.m_data[1] = 0x40;
  uVar7 = 3;
  textureSizes[0].size.m_data[2] = 3;
  textureSizes[1].name = "size_npot";
  textureSizes[1].size.m_data[0] = 0x11;
  textureSizes[1].size.m_data[1] = 0x17;
  OVar15 = OFFSETSIZE_NONE;
  textureSizes[1].size.m_data[2] = textureSizes[0].size.m_data[2];
  do {
    if (OVar15 == 4) {
      return (int)uVar7;
    }
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               (char *)((long)&DAT_0099bf50 + (long)(int)(&DAT_0099bf50)[OVar15]),
               (char *)((long)&DAT_0099bf60 + (long)(int)(&DAT_0099bf60)[OVar15]));
    tcu::TestNode::addChild((TestNode *)this,node);
    OVar4 = OVar15 ^ OFFSETSIZE_LAST;
    uVar7 = (ulong)OVar4;
    OVar11 = OFFSETSIZE_NONE;
    while (OVar11 != OFFSETSIZE_LAST) {
      uVar7 = CONCAT71((int7)(uVar7 >> 8),OVar15 != OFFSETSIZE_NONE);
      local_368 = OVar11;
      if (((OVar15 != OFFSETSIZE_NONE) != (OVar11 == OFFSETSIZE_NONE)) &&
         (OVar5 = OVar11 ^ OFFSETSIZE_IMPLEMENTATION_MAXIMUM | OVar4, uVar7 = (ulong)OVar5,
         OVar5 != OFFSETSIZE_NONE)) {
        local_250 = node;
        if (OVar11 != OFFSETSIZE_NONE) {
          local_250 = (TestNode *)operator_new(0x70);
          pcVar13 = (char *)0x0;
          if (OVar11 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
            pcVar13 = "implementation_offset";
          }
          description = (char *)0x0;
          if (OVar11 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
            description = "Use offsets within the implementation range";
          }
          if (OVar11 == OFFSETSIZE_MINIMUM_REQUIRED) {
            pcVar13 = "min_required_offset";
            description = "Use offsets within Vulkan minimum required range";
          }
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)local_250,(this->super_TestCaseGroup).super_TestNode.m_testCtx
                     ,pcVar13,description);
          if (local_250 != node) {
            tcu::TestNode::addChild(node,local_250);
          }
        }
        local_35a = local_368 != OFFSETSIZE_MINIMUM_REQUIRED || OVar15 == OFFSETSIZE_LAST;
        local_360 = OVar15;
        for (uVar7 = 0; OVar15 = local_360, uVar7 != 3; uVar7 = uVar7 + 1) {
          local_364 = (&DAT_00bd30d8)[uVar7 * 4];
          if ((local_360 == OFFSETSIZE_NONE) || (local_364 != TEXTURETYPE_CUBE)) {
            node_00 = (TestNode *)operator_new(0x70);
            tcu::TestCaseGroup::TestCaseGroup
                      ((TestCaseGroup *)node_00,(this->super_TestCaseGroup).super_TestNode.m_testCtx
                       ,*(char **)(&DAT_00bd30d0 + uVar7 * 0x10),"");
            bVar23 = local_364 == TEXTURETYPE_CUBE;
            tcu::TestNode::addChild(local_250,node_00);
            lVar10 = 0;
            while (lVar10 != 4) {
              local_298 = lVar10;
              pTVar8 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar8,
                         (this->super_TestCaseGroup).super_TestNode.m_testCtx,formats[lVar10].name,
                         "");
              local_2a0 = pTVar8;
              tcu::TestNode::addChild(node_00,pTVar8);
              lVar14 = local_298;
              for (iVar17 = 0; iVar17 != bVar23 + 1; iVar17 = iVar17 + 1) {
                local_240 = local_2a0;
                if (iVar17 != 0) {
                  local_240 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)local_240,
                             (this->super_TestCaseGroup).super_TestNode.m_testCtx,"no_corners",
                             "Test case variants that don\'t sample around cube map corners");
                  lVar14 = local_298;
                  if (local_2a0 != local_240) {
                    tcu::TestNode::addChild(local_2a0,local_240);
                    lVar14 = local_298;
                  }
                }
                bVar24 = iVar17 != 0;
                local_2d0 = iVar17;
                for (lVar20 = 0; lVar20 != 2; lVar20 = lVar20 + 1) {
                  pTVar8 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar8,
                             (this->super_TestCaseGroup).super_TestNode.m_testCtx,
                             textureSizes[lVar20].name,"");
                  paVar3 = textureSizes + lVar20;
                  tcu::TestNode::addChild(local_240,pTVar8);
                  local_359 = (formats[lVar10].format.order - D & 0xfffffffd) == 0;
                  uVar12 = 0;
                  local_290 = lVar20;
                  while( true ) {
                    iVar19 = (int)uVar12;
                    if (iVar19 == 9) break;
                    if ((iVar19 != 0) == (bool)local_359) {
                      local_358 = uVar12;
                      local_2c8 = pTVar8;
                      if (iVar19 != 0) {
                        if ((iVar19 != 3) && (iVar19 != 1)) goto LAB_00605a7e;
                        pTVar9 = (TestNode *)operator_new(0x70);
                        pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
                        local_2f0._M_string_length = 0;
                        local_2f0.field_2._M_local_buf[0] = '\0';
                        std::operator+(&caseName_1,&local_2f0,"compare_");
                        std::operator+(&caseName,&caseName_1,
                                       &DAT_0099bf70 +
                                       *(int *)(&DAT_0099bf6c + (long)(int)local_358 * 4));
                        tcu::TestCaseGroup::TestCaseGroup
                                  ((TestCaseGroup *)pTVar9,pTVar2,caseName._M_dataplus._M_p,"");
                        std::__cxx11::string::~string((string *)&caseName);
                        std::__cxx11::string::~string((string *)&caseName_1);
                        std::__cxx11::string::~string((string *)&local_2f0);
                        lVar20 = local_290;
                        local_2c8 = pTVar9;
                        iVar17 = local_2d0;
                        if (pTVar9 != pTVar8) {
                          tcu::TestNode::addChild(pTVar8,pTVar9);
                          lVar20 = local_290;
                          iVar17 = local_2d0;
                        }
                      }
                      lVar14 = 8;
                      uVar12 = local_358;
                      for (lVar18 = 1; lVar18 != 4; lVar18 = lVar18 + 1) {
                        local_350 = (TestNode *)(ulong)*(uint *)((long)&DAT_00bd3100 + lVar14);
                        lVar20 = lVar18;
                        if (lVar14 == 0x28) {
                          lVar20 = 0;
                        }
                        swizzle.m_swizzle.m_data._0_8_ = &swizzle.m_isSome;
                        swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_R;
                        swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_R;
                        wrapT = (&DAT_00bd3108)[lVar20 * 4];
                        swizzle.m_isSome = false;
                        std::operator+(&local_2f0,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&swizzle,*(char **)(&UNK_00bd30f8 + lVar14));
                        std::operator+(&caseName_1,&local_2f0,"_");
                        std::operator+(&caseName,&caseName_1,(char *)(&DAT_00bd3100)[lVar20 * 2]);
                        std::__cxx11::string::~string((string *)&caseName_1);
                        std::__cxx11::string::~string((string *)&local_2f0);
                        std::__cxx11::string::~string((string *)&swizzle);
                        pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&caseName_1,caseName._M_dataplus._M_p,
                                   (allocator<char> *)&local_2c0);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_2f0,"",(allocator<char> *)&swizzle_1);
                        TVar22 = formats[lVar10].format;
                        swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_isSome = false;
                        pTVar9 = (TestNode *)
                                 makeTextureGatherCase
                                           (local_364,pTVar2,&caseName_1,&local_2f0,local_360,
                                            local_368,TVar22,(CompareMode)local_358,
                                            (WrapMode)local_350,wrapT,&swizzle,NEAREST,NEAREST,0,
                                            &paVar3->size,(uint)bVar24,IMAGE_BACKING_MODE_REGULAR);
                        tcu::TestNode::addChild(local_2c8,pTVar9);
                        std::__cxx11::string::~string((string *)&local_2f0);
                        std::__cxx11::string::~string((string *)&caseName_1);
                        pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                        std::operator+(&caseName_1,"sparse_",&caseName);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_2f0,"",(allocator<char> *)&local_2c0);
                        uVar12 = local_358;
                        swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_isSome = false;
                        pTVar9 = (TestNode *)
                                 makeTextureGatherCase
                                           (local_364,pTVar2,&caseName_1,&local_2f0,local_360,
                                            local_368,TVar22,(CompareMode)local_358,
                                            (WrapMode)local_350,wrapT,&swizzle,NEAREST,NEAREST,0,
                                            &paVar3->size,(uint)bVar24,IMAGE_BACKING_MODE_SPARSE);
                        tcu::TestNode::addChild(local_2c8,pTVar9);
                        std::__cxx11::string::~string((string *)&local_2f0);
                        std::__cxx11::string::~string((string *)&caseName_1);
                        std::__cxx11::string::~string((string *)&caseName);
                        lVar14 = lVar14 + 0x10;
                        lVar20 = local_290;
                        iVar17 = local_2d0;
                      }
                    }
LAB_00605a7e:
                    uVar12 = (ulong)((int)uVar12 + 1);
                  }
                  lVar14 = local_298;
                }
              }
              if (local_35a != '\0') {
                CVar21 = formats[lVar10].format.order;
                TVar22.type = SNORM_INT8;
                TVar22.order = CVar21;
                if ((CVar21 != D) && (CVar21 != DS)) {
                  pTVar8 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar8,
                             (this->super_TestCaseGroup).super_TestNode.m_testCtx,"texture_swizzle",
                             "");
                  tcu::TestNode::addChild(local_2a0,pTVar8);
                  uVar12 = 0;
                  local_350 = pTVar8;
                  while (CVar21 = TVar22.order, uVar12 != 6) {
                    swizzle_1.m_swizzle.m_data[0] = FUNCTION_DRAW;
                    swizzle_1.m_swizzle.m_data[1] = FUNCTION_DRAW_INDEXED;
                    swizzle_1.m_swizzle.m_data[2] = FUNCTION_DRAW_INDIRECT;
                    swizzle_1.m_swizzle.m_data[3] = FUNCTION_DRAW_INDEXED_INDIRECT;
                    caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                    caseName_1._M_string_length = 0;
                    swizzle_1.m_isSome = true;
                    caseName_1.field_2._M_local_buf[0] = '\0';
                    uVar16 = uVar12 & 0xffffffff;
                    lVar14 = 0;
                    local_358 = uVar12;
                    while( true ) {
                      if (lVar14 == 0x10) break;
                      TVar6 = (TextureSwizzleComponent)(uVar16 % 6);
                      *(TextureSwizzleComponent *)((long)swizzle_1.m_swizzle.m_data + lVar14) =
                           TVar6;
                      pcVar13 = "_";
                      if (lVar14 == 0) {
                        pcVar13 = "";
                      }
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
                      anon_unknown_0::operator<<((ostream *)&caseName,TVar6);
                      std::__cxx11::stringbuf::str();
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
                      de::toLower((string *)&swizzle,&local_2c0);
                      std::operator+(&local_2f0,pcVar13,(string *)&swizzle);
                      std::__cxx11::string::append((string *)&caseName_1);
                      std::__cxx11::string::~string((string *)&local_2f0);
                      std::__cxx11::string::~string((string *)&swizzle);
                      std::__cxx11::string::~string((string *)&local_2c0);
                      lVar14 = lVar14 + 4;
                      uVar16 = (ulong)((int)uVar16 + 1);
                    }
                    pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&caseName,caseName_1._M_dataplus._M_p,
                               (allocator<char> *)&local_2c0);
                    pTVar8 = local_350;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2f0,"",&local_369);
                    TVar22 = formats[lVar10].format;
                    swizzle.m_swizzle.m_data[0] = 0x40;
                    swizzle.m_swizzle.m_data[1] = 0x40;
                    swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_A;
                    pTVar9 = (TestNode *)
                             makeTextureGatherCase
                                       (local_364,pTVar2,&caseName,&local_2f0,local_360,local_368,
                                        TVar22,COMPAREMODE_NONE,REPEAT_GL,REPEAT_GL,&swizzle_1,
                                        NEAREST,NEAREST,0,(IVec3 *)&swizzle,0,
                                        IMAGE_BACKING_MODE_REGULAR);
                    tcu::TestNode::addChild(pTVar8,pTVar9);
                    std::__cxx11::string::~string((string *)&local_2f0);
                    std::__cxx11::string::~string((string *)&caseName);
                    pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                    std::operator+(&caseName,"sparse_",&caseName_1);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2f0,"",(allocator<char> *)&local_2c0);
                    swizzle.m_swizzle.m_data[0] = 0x40;
                    swizzle.m_swizzle.m_data[1] = 0x40;
                    swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_A;
                    pTVar8 = (TestNode *)
                             makeTextureGatherCase
                                       (local_364,pTVar2,&caseName,&local_2f0,local_360,local_368,
                                        TVar22,COMPAREMODE_NONE,REPEAT_GL,REPEAT_GL,&swizzle_1,
                                        NEAREST,NEAREST,0,(IVec3 *)&swizzle,0,
                                        IMAGE_BACKING_MODE_SPARSE);
                    tcu::TestNode::addChild(local_350,pTVar8);
                    std::__cxx11::string::~string((string *)&local_2f0);
                    std::__cxx11::string::~string((string *)&caseName);
                    std::__cxx11::string::~string((string *)&caseName_1);
                    uVar12 = local_358 + 1;
                  }
                }
                pTVar8 = (TestNode *)operator_new(0x70);
                tcu::TestCaseGroup::TestCaseGroup
                          ((TestCaseGroup *)pTVar8,
                           (this->super_TestCaseGroup).super_TestNode.m_testCtx,"filter_mode",
                           "Test that filter modes have no effect");
                tcu::TestNode::addChild(local_2a0,pTVar8);
                local_358 = (ulong)((CVar21 - D & 0xfffffffd) == 0);
                CVar1 = formats[lVar10].format.type;
                lVar14 = 0;
                local_2c8 = pTVar8;
                while (lVar14 != 5) {
                  local_350 = (TestNode *)(ulong)(uint)(&DAT_00bd3158)[lVar14 * 4];
                  local_290 = lVar14;
                  for (lVar20 = 0; lVar20 != 0x20; lVar20 = lVar20 + 0x10) {
                    magFilter = *(FilterMode *)((long)&DAT_00bd3138 + lVar20);
                    if ((CVar1 < UNORM_BYTE_44) && ((0x58U >> (CVar1 & UNSIGNED_INT16) & 1) != 0)) {
                      if (magFilter != NEAREST) {
LAB_00605f28:
                        if ((CVar1 < HALF_FLOAT) &&
                           ((0x2c0000000U >> ((ulong)CVar1 & 0x3f) & 1) != 0)) {
                          if ((magFilter == NEAREST) && ((int)local_350 == 2)) {
LAB_00605f5b:
                            local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
                            local_2c0._M_string_length = 0;
                            local_2c0.field_2._M_local_buf[0] = '\0';
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&swizzle,&local_2c0,"min_");
                            std::operator+(&local_2f0,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&swizzle,(char *)(&DAT_00bd3150)[lVar14 * 2]);
                            std::operator+(&caseName_1,&local_2f0,"_mag_");
                            std::operator+(&caseName,&caseName_1,
                                           *(char **)((long)&DAT_00bd3130 + lVar20));
                            std::__cxx11::string::~string((string *)&caseName_1);
                            std::__cxx11::string::~string((string *)&local_2f0);
                            std::__cxx11::string::~string((string *)&swizzle);
                            std::__cxx11::string::~string((string *)&local_2c0);
                            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&caseName_1,caseName._M_dataplus._M_p,
                                       (allocator<char> *)&swizzle_1);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_2f0,"",&local_369);
                            TVar22 = formats[lVar10].format;
                            swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_isSome = false;
                            local_2c0._M_dataplus._M_p = (pointer)0x4000000040;
                            local_2c0._M_string_length._0_4_ = 3;
                            pTVar8 = (TestNode *)
                                     makeTextureGatherCase
                                               (local_364,pTVar2,&caseName_1,&local_2f0,local_360,
                                                local_368,TVar22,(CompareMode)local_358,REPEAT_GL,
                                                REPEAT_GL,&swizzle,(FilterMode)local_350,magFilter,0
                                                ,(IVec3 *)&local_2c0,0,IMAGE_BACKING_MODE_REGULAR);
                            tcu::TestNode::addChild(local_2c8,pTVar8);
                            std::__cxx11::string::~string((string *)&local_2f0);
                            std::__cxx11::string::~string((string *)&caseName_1);
                            pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                            std::operator+(&caseName_1,"sparse_",&caseName);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_2f0,"",(allocator<char> *)&swizzle_1);
                            swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_isSome = false;
                            local_2c0._M_dataplus._M_p = (pointer)0x4000000040;
                            local_2c0._M_string_length =
                                 CONCAT44(local_2c0._M_string_length._4_4_,3);
                            pTVar8 = (TestNode *)
                                     makeTextureGatherCase
                                               (local_364,pTVar2,&caseName_1,&local_2f0,local_360,
                                                local_368,TVar22,(CompareMode)local_358,REPEAT_GL,
                                                REPEAT_GL,&swizzle,(FilterMode)local_350,magFilter,0
                                                ,(IVec3 *)&local_2c0,0,IMAGE_BACKING_MODE_SPARSE);
                            tcu::TestNode::addChild(local_2c8,pTVar8);
                            std::__cxx11::string::~string((string *)&local_2f0);
                            std::__cxx11::string::~string((string *)&caseName_1);
                            std::__cxx11::string::~string((string *)&caseName);
                          }
                        }
                        else if ((2 < CVar1 - SIGNED_INT8) ||
                                ((int)local_350 == 2 && magFilter == NEAREST)) goto LAB_00605f5b;
                      }
                    }
                    else if (((byte)local_358 & magFilter == NEAREST) == 0) goto LAB_00605f28;
                  }
                  lVar14 = local_290 + 1;
                }
                pTVar8 = (TestNode *)operator_new(0x70);
                tcu::TestCaseGroup::TestCaseGroup
                          ((TestCaseGroup *)pTVar8,
                           (this->super_TestCaseGroup).super_TestNode.m_testCtx,"base_level","");
                tcu::TestNode::addChild(local_2a0,pTVar8);
                TVar6 = TEXTURESWIZZLECOMPONENT_G;
                while( true ) {
                  swizzle_1.m_swizzle.m_data[0] = TVar6;
                  lVar14 = local_298;
                  if (2 < (int)TVar6) break;
                  de::toString<int>(&caseName_1,(int *)&swizzle_1);
                  std::operator+(&caseName,"level_",&caseName_1);
                  std::__cxx11::string::~string((string *)&caseName_1);
                  bVar24 = (formats[lVar10].format.order - D & 0xfffffffd) == 0;
                  pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&caseName_1,caseName._M_dataplus._M_p,&local_369);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2f0,"",&local_2c9);
                  TVar22 = formats[lVar10].format;
                  swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_isSome = false;
                  local_2c0._M_dataplus._M_p = (pointer)0x4000000040;
                  local_2c0._M_string_length._0_4_ = 3;
                  pTVar9 = (TestNode *)
                           makeTextureGatherCase
                                     (local_364,pTVar2,&caseName_1,&local_2f0,local_360,local_368,
                                      TVar22,(uint)bVar24,REPEAT_GL,REPEAT_GL,&swizzle,NEAREST,
                                      NEAREST,swizzle_1.m_swizzle.m_data[0],(IVec3 *)&local_2c0,0,
                                      IMAGE_BACKING_MODE_REGULAR);
                  tcu::TestNode::addChild(pTVar8,pTVar9);
                  std::__cxx11::string::~string((string *)&local_2f0);
                  std::__cxx11::string::~string((string *)&caseName_1);
                  pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
                  std::operator+(&caseName_1,"sparse_",&caseName);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2f0,"",&local_369);
                  swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_isSome = false;
                  local_2c0._M_dataplus._M_p = (pointer)0x4000000040;
                  local_2c0._M_string_length = CONCAT44(local_2c0._M_string_length._4_4_,3);
                  pTVar9 = (TestNode *)
                           makeTextureGatherCase
                                     (local_364,pTVar2,&caseName_1,&local_2f0,local_360,local_368,
                                      TVar22,(uint)bVar24,REPEAT_GL,REPEAT_GL,&swizzle,NEAREST,
                                      NEAREST,swizzle_1.m_swizzle.m_data[0],(IVec3 *)&local_2c0,0,
                                      IMAGE_BACKING_MODE_SPARSE);
                  tcu::TestNode::addChild(pTVar8,pTVar9);
                  std::__cxx11::string::~string((string *)&local_2f0);
                  std::__cxx11::string::~string((string *)&caseName_1);
                  std::__cxx11::string::~string((string *)&caseName);
                  TVar6 = swizzle_1.m_swizzle.m_data[0] + TEXTURESWIZZLECOMPONENT_G;
                }
              }
              lVar10 = lVar14 + 1;
            }
          }
        }
      }
      OVar11 = local_368 + OFFSETSIZE_MINIMUM_REQUIRED;
    }
    OVar15 = OVar15 + OFFSETSIZE_MINIMUM_REQUIRED;
  } while( true );
}

Assistant:

void TextureGatherTests::init (void)
{
	const struct
	{
		const char* name;
		TextureType type;
	} textureTypes[] =
	{
		{ "2d",			TEXTURETYPE_2D			},
		{ "2d_array",	TEXTURETYPE_2D_ARRAY	},
		{ "cube",		TEXTURETYPE_CUBE		}
	};

	const struct
	{
		const char*			name;
		tcu::TextureFormat	format;
	} formats[] =
	{
		{ "rgba8",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8)		},
		{ "rgba8ui",	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8)	},
		{ "rgba8i",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT8)	},
		{ "depth32f",	tcu::TextureFormat(tcu::TextureFormat::D,		tcu::TextureFormat::FLOAT)			}
	};

	const struct
	{
		const char*		name;
		IVec3			size;
	} textureSizes[] =
	{
		{ "size_pot",	IVec3(64, 64, 3) },
		{ "size_npot",	IVec3(17, 23, 3) }
	};

	const struct
	{
		const char*				name;
		tcu::Sampler::WrapMode	mode;
	} wrapModes[] =
	{
		{ "clamp_to_edge",		tcu::Sampler::CLAMP_TO_EDGE			},
		{ "repeat",				tcu::Sampler::REPEAT_GL				},
		{ "mirrored_repeat",	tcu::Sampler::MIRRORED_REPEAT_GL	}
	};

	for (int gatherTypeI = 0; gatherTypeI < GATHERTYPE_LAST; gatherTypeI++)
	{
		const GatherType		gatherType			= (GatherType)gatherTypeI;
		TestCaseGroup* const	gatherTypeGroup		= new TestCaseGroup(m_testCtx, gatherTypeName(gatherType), gatherTypeDescription(gatherType));
		addChild(gatherTypeGroup);

		for (int offsetSizeI = 0; offsetSizeI < OFFSETSIZE_LAST; offsetSizeI++)
		{
			const OffsetSize offsetSize = (OffsetSize)offsetSizeI;
			if ((gatherType == GATHERTYPE_BASIC) != (offsetSize == OFFSETSIZE_NONE))
				continue;

			if (gatherType == GATHERTYPE_OFFSETS && offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) // \note offsets argument must be compile-time constant
				continue;

			TestCaseGroup* const offsetSizeGroup = offsetSize == OFFSETSIZE_NONE ?
													gatherTypeGroup :
													new TestCaseGroup(m_testCtx,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "min_required_offset"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "implementation_offset"
																	  : DE_NULL,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "Use offsets within Vulkan minimum required range"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "Use offsets within the implementation range"
																	  : DE_NULL);

			if (offsetSizeGroup != gatherTypeGroup)
				gatherTypeGroup->addChild(offsetSizeGroup);

			for (int textureTypeNdx = 0; textureTypeNdx < DE_LENGTH_OF_ARRAY(textureTypes); textureTypeNdx++)
			{
				const TextureType textureType = textureTypes[textureTypeNdx].type;

				if (textureType == TEXTURETYPE_CUBE && gatherType != GATHERTYPE_BASIC)
					continue;

				TestCaseGroup* const textureTypeGroup = new TestCaseGroup(m_testCtx, textureTypes[textureTypeNdx].name, "");
				offsetSizeGroup->addChild(textureTypeGroup);

				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const tcu::TextureFormat&	format			= formats[formatNdx].format;
					TestCaseGroup* const		formatGroup		= new TestCaseGroup(m_testCtx, formats[formatNdx].name, "");
					textureTypeGroup->addChild(formatGroup);

					for (int noCornersI = 0; noCornersI <= ((textureType == TEXTURETYPE_CUBE)?1:0); noCornersI++)
					{
						const bool				noCorners		= noCornersI!= 0;
						TestCaseGroup* const	cornersGroup	= noCorners
																? new TestCaseGroup(m_testCtx, "no_corners", "Test case variants that don't sample around cube map corners")
																: formatGroup;

						if (formatGroup != cornersGroup)
							formatGroup->addChild(cornersGroup);

						for (int textureSizeNdx = 0; textureSizeNdx < DE_LENGTH_OF_ARRAY(textureSizes); textureSizeNdx++)
						{
							const IVec3&			textureSize			= textureSizes[textureSizeNdx].size;
							TestCaseGroup* const	textureSizeGroup	= new TestCaseGroup(m_testCtx, textureSizes[textureSizeNdx].name, "");
							cornersGroup->addChild(textureSizeGroup);

							for (int compareModeI = 0; compareModeI < tcu::Sampler::COMPAREMODE_LAST; compareModeI++)
							{
								const tcu::Sampler::CompareMode compareMode = (tcu::Sampler::CompareMode)compareModeI;

								if ((compareMode != tcu::Sampler::COMPAREMODE_NONE) != isDepthFormat(format))
									continue;

								if (compareMode != tcu::Sampler::COMPAREMODE_NONE &&
									compareMode != tcu::Sampler::COMPAREMODE_LESS &&
									compareMode != tcu::Sampler::COMPAREMODE_GREATER)
									continue;

								TestCaseGroup* const compareModeGroup = compareMode == tcu::Sampler::COMPAREMODE_NONE ?
																			textureSizeGroup :
																			new TestCaseGroup(m_testCtx,
																							  (string() + "compare_" + compareModeName(compareMode)).c_str(),
																							  "");
								if (compareModeGroup != textureSizeGroup)
									textureSizeGroup->addChild(compareModeGroup);

								for (int wrapCaseNdx = 0; wrapCaseNdx < DE_LENGTH_OF_ARRAY(wrapModes); wrapCaseNdx++)
								{
									const int						wrapSNdx	= wrapCaseNdx;
									const int						wrapTNdx	= (wrapCaseNdx + 1) % DE_LENGTH_OF_ARRAY(wrapModes);
									const tcu::Sampler::WrapMode	wrapS		= wrapModes[wrapSNdx].mode;
									const tcu::Sampler::WrapMode	wrapT		= wrapModes[wrapTNdx].mode;

									const string caseName = string() + wrapModes[wrapSNdx].name + "_" + wrapModes[wrapTNdx].name;

									compareModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format, compareMode, wrapS, wrapT,
																					 MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, textureSize,
																					 noCorners ? GATHERCASE_DONT_SAMPLE_CUBE_CORNERS : 0));
									compareModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format, compareMode, wrapS, wrapT,
																					 MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, textureSize,
																					 noCorners ? GATHERCASE_DONT_SAMPLE_CUBE_CORNERS : 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
								}
							}
						}
					}

					if (offsetSize != OFFSETSIZE_MINIMUM_REQUIRED || gatherType == GATHERTYPE_OFFSETS) // Don't test all features for both offset size types, as they should be rather orthogonal.
					{
						if (!isDepthFormat(format))
						{
							TestCaseGroup* const swizzleGroup = new TestCaseGroup(m_testCtx, "texture_swizzle", "");
							formatGroup->addChild(swizzleGroup);

							DE_STATIC_ASSERT(TEXTURESWIZZLECOMPONENT_R == 0);
							for (int swizzleCaseNdx = 0; swizzleCaseNdx < TEXTURESWIZZLECOMPONENT_LAST; swizzleCaseNdx++)
							{
								MaybeTextureSwizzle	swizzle	= MaybeTextureSwizzle::createSomeTextureSwizzle();
								string				caseName;

								for (int i = 0; i < 4; i++)
								{
									swizzle.getSwizzle()[i] = (TextureSwizzleComponent)((swizzleCaseNdx + i) % (int)TEXTURESWIZZLECOMPONENT_LAST);
									caseName += (i > 0 ? "_" : "") + de::toLower(de::toString(swizzle.getSwizzle()[i]));
								}

								swizzleGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format,
																			 tcu::Sampler::COMPAREMODE_NONE, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			 swizzle, tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, IVec3(64, 64, 3)));
								swizzleGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format,
																			 tcu::Sampler::COMPAREMODE_NONE, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			 swizzle, tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, IVec3(64, 64, 3), 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
							}
						}

						{
							TestCaseGroup* const filterModeGroup = new TestCaseGroup(m_testCtx, "filter_mode", "Test that filter modes have no effect");
							formatGroup->addChild(filterModeGroup);

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} magFilters[] =
							{
								{ "linear",		tcu::Sampler::LINEAR	},
								{ "nearest",	tcu::Sampler::NEAREST	}
							};

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} minFilters[] =
							{
								// \note Don't test NEAREST here, as it's covered by other cases.
								{ "linear",						tcu::Sampler::LINEAR					},
								{ "nearest_mipmap_nearest",		tcu::Sampler::NEAREST_MIPMAP_NEAREST	},
								{ "nearest_mipmap_linear",		tcu::Sampler::NEAREST_MIPMAP_LINEAR		},
								{ "linear_mipmap_nearest",		tcu::Sampler::LINEAR_MIPMAP_NEAREST		},
								{ "linear_mipmap_linear",		tcu::Sampler::LINEAR_MIPMAP_LINEAR		},
							};

							for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(minFilters); minFilterNdx++)
							for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); magFilterNdx++)
							{
								const tcu::Sampler::FilterMode		minFilter		= minFilters[minFilterNdx].filter;
								const tcu::Sampler::FilterMode		magFilter		= magFilters[magFilterNdx].filter;
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;

								if ((isUnormFormatType(format.type) || isDepthFormat(format)) && magFilter == tcu::Sampler::NEAREST)
									continue; // Covered by other cases.
								if ((isUIntFormatType(format.type) || isSIntFormatType(format.type)) &&
									(magFilter != tcu::Sampler::NEAREST || minFilter != tcu::Sampler::NEAREST_MIPMAP_NEAREST))
									continue;

								const string caseName = string() + "min_" + minFilters[minFilterNdx].name + "_mag_" + magFilters[magFilterNdx].name;

								filterModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format, compareMode,
																				tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, MaybeTextureSwizzle::createNoneTextureSwizzle(),
																				minFilter, magFilter, 0, IVec3(64, 64, 3)));
								filterModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format, compareMode,
																				tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, MaybeTextureSwizzle::createNoneTextureSwizzle(),
																				minFilter, magFilter, 0, IVec3(64, 64, 3), 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
							}
						}

						{
							TestCaseGroup* const baseLevelGroup = new TestCaseGroup(m_testCtx, "base_level", "");
							formatGroup->addChild(baseLevelGroup);

							for (int baseLevel = 1; baseLevel <= 2; baseLevel++)
							{
								const string						caseName		= "level_" + de::toString(baseLevel);
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;
								baseLevelGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format,
																			   compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			   MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST,
																			   baseLevel, IVec3(64, 64, 3)));
								baseLevelGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format,
																			   compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			   MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST,
																			   baseLevel, IVec3(64, 64, 3), 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
							}
						}
					}
				}
			}
		}
	}
}